

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cc
# Opt level: O0

void __thiscall
kratos::AssignmentTypeBlockVisitor::visit
          (AssignmentTypeBlockVisitor *this,SequentialStmtBlock *block)

{
  bool bVar1;
  Generator *this_00;
  vector<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>
  *this_01;
  element_type *peVar2;
  IRNode *root;
  undefined1 local_98 [8];
  AssignmentTypeVisitor visitor;
  shared_ptr<kratos::Attribute> *attr;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>
  *__range2;
  vector<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>
  *attributes;
  Generator *parent;
  SequentialStmtBlock *block_local;
  AssignmentTypeBlockVisitor *this_local;
  
  this_00 = Stmt::generator_parent((Stmt *)block);
  if ((this_00 == (Generator *)0x0) ||
     ((bVar1 = Generator::is_cloned(this_00), !bVar1 &&
      (bVar1 = Generator::external(this_00), !bVar1)))) {
    this_01 = IRNode::get_attributes((IRNode *)block);
    __end2 = std::
             vector<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>
             ::begin(this_01);
    attr = (shared_ptr<kratos::Attribute> *)
           std::
           vector<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>
           ::end(this_01);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_std::shared_ptr<kratos::Attribute>_*,_std::vector<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>_>
                                       *)&attr), bVar1) {
      visitor._72_8_ =
           __gnu_cxx::
           __normal_iterator<const_std::shared_ptr<kratos::Attribute>_*,_std::vector<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>_>
           ::operator*(&__end2);
      peVar2 = std::__shared_ptr_access<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)visitor._72_8_);
      bVar1 = std::operator==(&peVar2->type_str,"check_assignment");
      if (bVar1) {
        peVar2 = std::
                 __shared_ptr_access<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)visitor._72_8_);
        bVar1 = std::operator==(&peVar2->value_str,"false");
        if (bVar1) {
          return;
        }
      }
      __gnu_cxx::
      __normal_iterator<const_std::shared_ptr<kratos::Attribute>_*,_std::vector<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>_>
      ::operator++(&__end2);
    }
    AssignmentTypeVisitor::AssignmentTypeVisitor((AssignmentTypeVisitor *)local_98,NonBlocking,true)
    ;
    root = IRNode::ast_node((IRNode *)block);
    IRVisitor::visit_root((IRVisitor *)local_98,root);
    AssignmentTypeVisitor::~AssignmentTypeVisitor((AssignmentTypeVisitor *)local_98);
  }
  return;
}

Assistant:

void visit(SequentialStmtBlock* block) override {
        auto* parent = block->generator_parent();
        if (parent && (parent->is_cloned() || parent->external())) return;
        // attribute-based override
        auto const& attributes = block->get_attributes();
        for (auto const& attr : attributes) {
            if (attr->type_str == "check_assignment" && attr->value_str == "false") return;
        }
        AssignmentTypeVisitor visitor(AssignmentType::NonBlocking, true);
        visitor.visit_root(block->ast_node());
    }